

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionGraph.cpp
# Opt level: O0

void DumpGraph(ScopeData *scope)

{
  undefined1 local_acd0 [8];
  ExpressionGraphContext exprGraphCtx;
  char tempBuf [4096];
  char outputBuf [4096];
  undefined1 local_8ca8 [8];
  OutputContext outputCtx;
  ExpressionContext exprCtx;
  ScopeData *scope_local;
  
  ExpressionContext::ExpressionContext
            ((ExpressionContext *)&outputCtx.closeStream,(Allocator *)0x0,0);
  OutputContext::OutputContext((OutputContext *)local_8ca8);
  outputCtx.outputBufDef._248_8_ = tempBuf + 0xff8;
  outputCtx.outputBuf._0_4_ = 0x1000;
  outputCtx.tempBufDef._248_8_ = &exprGraphCtx.depth;
  outputCtx.tempBuf._0_4_ = 0x1000;
  outputCtx._536_8_ = OutputContext::FileOpen("expr_graph.txt");
  outputCtx.openStream = OutputContext::FileWrite;
  ExpressionGraphContext::ExpressionGraphContext
            ((ExpressionGraphContext *)local_acd0,(ExpressionContext *)&outputCtx.closeStream,
             (OutputContext *)local_8ca8);
  PrintGraph((ExpressionGraphContext *)local_acd0,scope,true);
  PrintGraph((ExpressionGraphContext *)local_acd0,scope,false);
  OutputContext::FileClose((void *)outputCtx._536_8_);
  outputCtx.tempBufSize = 0;
  outputCtx._540_4_ = 0;
  OutputContext::~OutputContext((OutputContext *)local_8ca8);
  ExpressionContext::~ExpressionContext((ExpressionContext *)&outputCtx.closeStream);
  return;
}

Assistant:

void DumpGraph(ScopeData *scope)
{
	ExpressionContext exprCtx(0, 0);
	OutputContext outputCtx;

	char outputBuf[4096];
	outputCtx.outputBuf = outputBuf;
	outputCtx.outputBufSize = 4096;

	char tempBuf[4096];
	outputCtx.tempBuf = tempBuf;
	outputCtx.tempBufSize = 4096;

	outputCtx.stream = OutputContext::FileOpen("expr_graph.txt");
	outputCtx.writeStream = OutputContext::FileWrite;

	ExpressionGraphContext exprGraphCtx(exprCtx, outputCtx);

	PrintGraph(exprGraphCtx, scope, true);

	PrintGraph(exprGraphCtx, scope, false);

	OutputContext::FileClose(outputCtx.stream);
	outputCtx.stream = NULL;
}